

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

bool QUtil::is_utf16(string *val)

{
  char *pcVar1;
  char cVar2;
  
  if (val->_M_string_length < 2) {
    return false;
  }
  pcVar1 = (val->_M_dataplus)._M_p;
  cVar2 = *pcVar1;
  if (cVar2 == -2) {
    cVar2 = -1;
  }
  else {
    if (cVar2 != -1) {
      return false;
    }
    cVar2 = -2;
  }
  return pcVar1[1] == cVar2;
}

Assistant:

bool
QUtil::is_utf16(std::string const& val)
{
    return (
        (val.length() >= 2) &&
        (((val.at(0) == '\xfe') && (val.at(1) == '\xff')) ||
         ((val.at(0) == '\xff') && (val.at(1) == '\xfe'))));
}